

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

int mbedtls_asn1_write_tagged_string(uchar **p,uchar *start,int tag,char *text,size_t text_len)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  puVar1 = *p;
  uVar4 = 0xffffff94;
  if (text_len <= (ulong)((long)puVar1 - (long)start) && start <= puVar1) {
    *p = puVar1 + -text_len;
    memcpy(puVar1 + -text_len,text,text_len);
    uVar3 = (uint)text_len;
    uVar4 = uVar3;
    if (((-1 < (int)uVar3) &&
        (uVar2 = mbedtls_asn1_write_len(p,start,(ulong)(uVar3 & 0x7fffffff)), uVar4 = uVar2,
        -1 < (int)uVar2)) &&
       (puVar1 = *p, uVar4 = 0xffffff94, puVar1 != start && -1 < (long)puVar1 - (long)start)) {
      *p = puVar1 + -1;
      puVar1[-1] = (uchar)tag;
      uVar4 = uVar3 + uVar2 + 1;
    }
  }
  return uVar4;
}

Assistant:

int mbedtls_asn1_write_tagged_string(unsigned char **p, const unsigned char *start, int tag,
                                     const char *text, size_t text_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) text,
                                                            text_len));

    return mbedtls_asn1_write_len_and_tag(p, start, len, tag);
}